

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcAnnotationSurfaceOccurrence::~IfcAnnotationSurfaceOccurrence
          (IfcAnnotationSurfaceOccurrence *this)

{
  ~IfcAnnotationSurfaceOccurrence
            ((IfcAnnotationSurfaceOccurrence *)
             &this[-1].super_IfcAnnotationOccurrence.super_IfcStyledItem.
              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>.field_0x18);
  return;
}

Assistant:

IfcAnnotationSurfaceOccurrence() : Object("IfcAnnotationSurfaceOccurrence") {}